

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreRycycleSta(Gia_ManAre_t *p,Gia_StaAre_t *pSta)

{
  uint uVar1;
  int iVar2;
  
  memset(pSta,0,(long)(p->nSize << 2));
  iVar2 = p->nStas;
  uVar1 = iVar2 - 1;
  if ((Gia_StaAre_t *)
      ((long)p->nSize * (ulong)(uVar1 & 0xfffff) * 4 +
      *(long *)((long)p->ppStas + (ulong)(uVar1 >> 0x11 & 0x3ff8))) == pSta) {
    p->nStas = uVar1;
    if (iVar2 == p->nStaPages * 0x100000 + -0xfffff) {
      p->nStaPages = p->nStaPages + -1;
    }
  }
  return;
}

Assistant:

static inline void Gia_ManAreRycycleSta( Gia_ManAre_t * p, Gia_StaAre_t * pSta )
{
    memset( pSta, 0, p->nSize << 2 );
    if ( pSta == Gia_ManAreStaLast(p) )
    {
        p->nStas--;
        if ( p->nStas == (p->nStaPages-1) * MAX_ITEM_NUM )
            p->nStaPages--;
    }
    else
    {
//        Gia_StaSetUnused( pSta );
    }
}